

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * declaration_specifiers(dmr_C *C,token *token,decl_state *ctx)

{
  uint *puVar1;
  symbol_op *psVar2;
  global_symbols_t *S;
  keyword kVar3;
  int iVar4;
  symbol *psVar5;
  position *ppVar6;
  uint uVar7;
  uint uVar8;
  int local_38;
  int local_34;
  
  uVar8 = 0;
  local_38 = 0;
  local_34 = 0;
  do {
    uVar7 = uVar8 | 3;
    while( true ) {
      if ((((*(uint *)token & 0x3f) != 2) ||
          (psVar5 = dmrC_lookup_symbol((ident *)*(position *)((long)token + 0x10),
                                       NS_SYMBOL|NS_TYPEDEF), psVar5 == (symbol *)0x0)) ||
         ((*(uint *)psVar5 >> 9 & 1) == 0)) goto LAB_00115ee0;
      if ((char)*(uint *)psVar5 == '\x11') break;
      if ((uVar8 & 0x3c1) != 0) goto LAB_00115ee0;
      (ctx->ctype).base_type = (psVar5->field_14).field_2.ctype.base_type;
      apply_ctype(C,token->pos,&(psVar5->field_14).field_2.ctype,&ctx->ctype);
      token = *(token **)((long)token + 8);
      uVar8 = uVar7;
    }
    psVar2 = psVar5->op;
    kVar3 = psVar2->type;
    if ((kVar3 & KW_SPECIFIER) != 0) {
      uVar7 = psVar2->test & uVar8;
      if (uVar7 != 0) {
        ppVar6 = (position *)((long)token + 0x10);
        goto LAB_00115ed1;
      }
      uVar8 = uVar8 | psVar2->set;
      local_38 = local_38 + psVar2->cls;
      if (((uint)psVar2->set >> 0xb & 1) != 0) {
        local_34 = 2;
      }
      if ((char)kVar3 < '\0') {
        local_34 = -1;
      }
      else if ((kVar3 >> 8 & 1) != 0) {
        if (local_34 == 0) {
          local_34 = 1;
        }
        else {
          local_34 = local_34 + 1;
          if (local_38 == 3) {
            ppVar6 = (position *)&C->S->double_ident;
            local_38 = 3;
            uVar7 = 0x400;
LAB_00115ed1:
            specifier_conflict(C,token->pos,uVar7,(ident *)*ppVar6);
LAB_00115ee0:
            if ((uVar8 & 2) == 0) {
              if ((uVar8 & 0x3c1) == 0) {
                psVar5 = &C->S->incomplete_ctype;
              }
              else {
                psVar5 = C->P->types[local_38][local_34];
              }
              (ctx->ctype).base_type = psVar5;
            }
            uVar8 = (uint)(ctx->ctype).modifiers;
            if ((int)uVar8 < 0) {
              (ctx->ctype).modifiers = (ulong)(uVar8 & 0x7fffffff);
              S = C->S;
              iVar4 = dmrC_is_int_type(S,(ctx->ctype).base_type);
              if (iVar4 == 0) {
                dmrC_sparse_error(C,token->pos,"invalid modifier");
              }
              else {
                psVar5 = dmrC_alloc_symbol(S,token->pos,2);
                memcpy(psVar5,(ctx->ctype).base_type,0xe8);
                puVar1 = (uint *)((long)&psVar5->field_14 + 0x18);
                *puVar1 = *puVar1 & 0xbfffe03f;
                (psVar5->field_14).field_2.ctype.base_type = (ctx->ctype).base_type;
                *(undefined1 *)psVar5 = 0xf;
                (ctx->ctype).base_type = psVar5;
                dmrC_create_fouled(C->S,psVar5);
              }
            }
            return (token *)(position)token;
          }
          uVar8 = uVar8 | 0x400;
        }
      }
    }
    token = *(token **)((long)token + 8);
    if (psVar2->declarator != (_func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *)0x0) {
      token = (*psVar2->declarator)(C,token,ctx);
      kVar3 = psVar5->op->type;
    }
    if ((kVar3 >> 9 & 1) != 0) {
      (ctx->ctype).base_type = (psVar5->field_14).field_2.ctype.base_type;
      (ctx->ctype).modifiers = (ctx->ctype).modifiers | (psVar5->field_14).field_2.ctype.modifiers;
    }
  } while( true );
}

Assistant:

static struct token *declaration_specifiers(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	int seen = 0;
	int cls = CInt;
	int size = 0;

	while (dmrC_token_type(token) == TOKEN_IDENT) {
		struct symbol *s = dmrC_lookup_symbol(token->ident,
						 NS_TYPEDEF | NS_SYMBOL);
		if (!s || !(s->ns & NS_TYPEDEF))
			break;
		if (s->type != SYM_KEYWORD) {
			if (seen & Set_Any)
				break;
			seen |= Set_S | Set_T;
			ctx->ctype.base_type = s->ctype.base_type;
			apply_ctype(C, token->pos, &s->ctype, &ctx->ctype);
			token = token->next;
			continue;
		}
		if (s->op->type & KW_SPECIFIER) {
			if (seen & s->op->test) {
				specifier_conflict(C, token->pos,
						   seen & s->op->test,
						   token->ident);
				break;
			}
			seen |= s->op->set;
			cls += s->op->cls;
			if (s->op->set & Set_Int128)
				size = 2;
			if (s->op->type & KW_SHORT) {
				size = -1;
			} else if (s->op->type & KW_LONG && size++) {
				if (cls == CReal) {
					specifier_conflict(C, token->pos,
							   Set_Vlong,
							   C->S->double_ident);
					break;
				}
				seen |= Set_Vlong;
			}
		}
		token = token->next;
		if (s->op->declarator)
			token = s->op->declarator(C, token, ctx);
		if (s->op->type & KW_EXACT) {
			ctx->ctype.base_type = s->ctype.base_type;
			ctx->ctype.modifiers |= s->ctype.modifiers;
		}
	}

	if (!(seen & Set_S)) {	/* not set explicitly? */
		struct symbol *base = &C->S->incomplete_ctype;
		if (seen & Set_Any)
			base = C->P->types[cls][size];
		ctx->ctype.base_type = base;
	}

	if (ctx->ctype.modifiers & MOD_BITWISE) {
		struct symbol *type;
		ctx->ctype.modifiers &= ~MOD_BITWISE;
		if (!dmrC_is_int_type(C->S, ctx->ctype.base_type)) {
			dmrC_sparse_error(C, token->pos, "invalid modifier");
			return token;
		}
		type = dmrC_alloc_symbol(C->S, token->pos, SYM_BASETYPE);
		*type = *ctx->ctype.base_type;
		type->ctype.modifiers &= ~MOD_SPECIFIER;
		type->ctype.base_type = ctx->ctype.base_type;
		type->type = SYM_RESTRICT;
		ctx->ctype.base_type = type;
		dmrC_create_fouled(C->S, type);
	}
	return token;
}